

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

bool Js::DynamicProfileInfo::IsEnabled_OptionalFunctionBody
               (FunctionBody *functionBody,ScriptContext *scriptContext)

{
  Utf8SourceInfo *pUVar1;
  code *pcVar2;
  bool bVar3;
  undefined1 uVar4;
  uint uVar5;
  undefined4 *puVar6;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0xf4,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_00970901;
    *puVar6 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    bVar3 = Phases::IsEnabledForAll((Phases *)&DAT_015bbe90,DynamicProfilePhase);
  }
  else {
    uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_00970901;
      *puVar6 = 0;
    }
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,DynamicProfilePhase,uVar5,
                              ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                               functionInfo.ptr)->functionId);
  }
  if (bVar3 == false) {
    if (functionBody == (FunctionBody *)0x0) {
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015b0240,DynamicProfilePhase);
    }
    else {
      uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) {
LAB_00970901:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015b0240,DynamicProfilePhase,uVar5,
                                ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
    }
    uVar4 = 1;
    if (((bVar3 == false) && (uVar4 = 1, (scriptContext->config).NoNative == true)) &&
       ((functionBody == (FunctionBody *)0x0 ||
        (((pUVar1 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo
                    .ptr, (pUVar1->debugModeSource).ptr == (uchar *)0x0 &&
          ((pUVar1->field_0xa8 & 0x20) == 0)) || ((pUVar1->field_0xa8 & 0x40) == 0)))))) {
      uVar4 = DynamicProfileStorage::collectInfo;
    }
  }
  else {
    uVar4 = 0;
  }
  return (bool)uVar4;
}

Assistant:

bool DynamicProfileInfo::IsEnabled_OptionalFunctionBody(const FunctionBody *const functionBody, const ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        return
            !PHASE_OFF_OPTFUNC(DynamicProfilePhase, functionBody) &&
            (
#if ENABLE_DEBUG_CONFIG_OPTIONS
                PHASE_FORCE_OPTFUNC(DynamicProfilePhase, functionBody) ||
#else
                Js::Configuration::Global.flags.ForceDynamicProfile ||
#endif
                !scriptContext->GetConfig()->IsNoNative() ||
                (functionBody && functionBody->IsInDebugMode())
#ifdef DYNAMIC_PROFILE_STORAGE
                || DynamicProfileStorage::DoCollectInfo()
#endif
                );
    }